

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_init_copy(mp_int *a,mp_int *b)

{
  int iVar1;
  
  iVar1 = mp_init(a);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mp_copy(b,a);
  return iVar1;
}

Assistant:

int mp_init_copy (mp_int * a, mp_int * b)
{
  int     res;

  if ((res = mp_init (a)) != MP_OKAY) {
    return res;
  }
  return mp_copy (b, a);
}